

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AMReX_Amr.cpp
# Opt level: O0

void __thiscall amrex::Amr::printGridInfo(Amr *this,ostream *os,int min_lev,int max_lev)

{
  int iVar1;
  pointer this_00;
  Long LVar2;
  Long LVar3;
  Geometry *this_01;
  FabArrayBase *this_02;
  ostream *poVar4;
  int in_ECX;
  int in_EDX;
  AmrLevel *in_RSI;
  undefined8 in_RDI;
  double dVar5;
  int i;
  Box *b;
  int k;
  DistributionMapping *map;
  Real frac;
  double ntot;
  Long ncells;
  int numgrid;
  BoxArray *bs;
  int lev;
  ostream *in_stack_ffffffffffffff68;
  AmrLevel *in_stack_ffffffffffffff70;
  int in_stack_ffffffffffffff80;
  int in_stack_ffffffffffffff84;
  Box *b_00;
  undefined4 in_stack_ffffffffffffffa8;
  int iVar6;
  int local_1c;
  
  for (local_1c = in_EDX; local_1c <= in_ECX; local_1c = local_1c + 1) {
    Vector<std::unique_ptr<amrex::AmrLevel,_std::default_delete<amrex::AmrLevel>_>,_std::allocator<std::unique_ptr<amrex::AmrLevel,_std::default_delete<amrex::AmrLevel>_>_>_>
    ::operator[]((Vector<std::unique_ptr<amrex::AmrLevel,_std::default_delete<amrex::AmrLevel>_>,_std::allocator<std::unique_ptr<amrex::AmrLevel,_std::default_delete<amrex::AmrLevel>_>_>_>
                  *)in_stack_ffffffffffffff70,(size_type)in_stack_ffffffffffffff68);
    this_00 = std::unique_ptr<amrex::AmrLevel,_std::default_delete<amrex::AmrLevel>_>::operator->
                        ((unique_ptr<amrex::AmrLevel,_std::default_delete<amrex::AmrLevel>_> *)
                         0x10e8e8c);
    AmrLevel::boxArray(this_00);
    LVar2 = BoxArray::size((BoxArray *)0x10e8ea3);
    Vector<std::unique_ptr<amrex::AmrLevel,_std::default_delete<amrex::AmrLevel>_>,_std::allocator<std::unique_ptr<amrex::AmrLevel,_std::default_delete<amrex::AmrLevel>_>_>_>
    ::operator[]((Vector<std::unique_ptr<amrex::AmrLevel,_std::default_delete<amrex::AmrLevel>_>,_std::allocator<std::unique_ptr<amrex::AmrLevel,_std::default_delete<amrex::AmrLevel>_>_>_>
                  *)in_stack_ffffffffffffff70,(size_type)in_stack_ffffffffffffff68);
    std::unique_ptr<amrex::AmrLevel,_std::default_delete<amrex::AmrLevel>_>::operator->
              ((unique_ptr<amrex::AmrLevel,_std::default_delete<amrex::AmrLevel>_> *)0x10e8ec5);
    LVar3 = AmrLevel::countCells((AmrLevel *)0x10e8ecd);
    this_01 = AmrMesh::Geom((AmrMesh *)in_stack_ffffffffffffff70,
                            (int)((ulong)in_stack_ffffffffffffff68 >> 0x20));
    Geometry::Domain(this_01);
    dVar5 = Box::d_numPts((Box *)CONCAT44(in_stack_ffffffffffffff84,in_stack_ffffffffffffff80));
    Vector<std::unique_ptr<amrex::AmrLevel,_std::default_delete<amrex::AmrLevel>_>,_std::allocator<std::unique_ptr<amrex::AmrLevel,_std::default_delete<amrex::AmrLevel>_>_>_>
    ::operator[]((Vector<std::unique_ptr<amrex::AmrLevel,_std::default_delete<amrex::AmrLevel>_>,_std::allocator<std::unique_ptr<amrex::AmrLevel,_std::default_delete<amrex::AmrLevel>_>_>_>
                  *)in_stack_ffffffffffffff70,(size_type)in_stack_ffffffffffffff68);
    std::unique_ptr<amrex::AmrLevel,_std::default_delete<amrex::AmrLevel>_>::operator->
              ((unique_ptr<amrex::AmrLevel,_std::default_delete<amrex::AmrLevel>_> *)0x10e8f33);
    this_02 = (FabArrayBase *)
              AmrLevel::get_new_data
                        (in_stack_ffffffffffffff70,(int)((ulong)in_stack_ffffffffffffff68 >> 0x20));
    FabArrayBase::DistributionMap(this_02);
    poVar4 = std::operator<<((ostream *)in_RSI,"  Level ");
    poVar4 = (ostream *)std::ostream::operator<<(poVar4,local_1c);
    poVar4 = std::operator<<(poVar4,"   ");
    poVar4 = (ostream *)std::ostream::operator<<(poVar4,(int)LVar2);
    poVar4 = std::operator<<(poVar4," grids  ");
    poVar4 = (ostream *)std::ostream::operator<<(poVar4,LVar3);
    poVar4 = std::operator<<(poVar4," cells  ");
    poVar4 = (ostream *)std::ostream::operator<<(poVar4,((double)LVar3 * 100.0) / dVar5);
    poVar4 = std::operator<<(poVar4," % of domain");
    std::operator<<(poVar4,'\n');
    for (iVar6 = 0; iVar6 < (int)LVar2; iVar6 = iVar6 + 1) {
      BoxArray::operator[]
                ((BoxArray *)CONCAT44(in_stack_ffffffffffffff84,in_stack_ffffffffffffff80),
                 (int)((ulong)in_RDI >> 0x20));
      b_00 = (Box *)&stack0xffffffffffffff84;
      poVar4 = std::operator<<((ostream *)in_RSI,' ');
      poVar4 = (ostream *)std::ostream::operator<<(poVar4,local_1c);
      std::operator<<(poVar4,": ");
      poVar4 = amrex::operator<<((ostream *)CONCAT44(iVar6,in_stack_ffffffffffffffa8),b_00);
      std::operator<<(poVar4,"   ");
      for (in_stack_ffffffffffffff80 = 0; in_stack_ffffffffffffff80 < 3;
          in_stack_ffffffffffffff80 = in_stack_ffffffffffffff80 + 1) {
        in_stack_ffffffffffffff70 = in_RSI;
        iVar1 = Box::length(b_00,in_stack_ffffffffffffff80);
        poVar4 = (ostream *)std::ostream::operator<<(in_stack_ffffffffffffff70,iVar1);
        std::operator<<(poVar4,' ');
      }
      in_stack_ffffffffffffff68 = std::operator<<((ostream *)in_RSI,":: ");
      iVar1 = DistributionMapping::operator[]
                        ((DistributionMapping *)in_stack_ffffffffffffff70,
                         (int)((ulong)in_stack_ffffffffffffff68 >> 0x20));
      poVar4 = (ostream *)std::ostream::operator<<(in_stack_ffffffffffffff68,iVar1);
      std::operator<<(poVar4,'\n');
    }
  }
  std::ostream::operator<<(in_RSI,std::endl<char,std::char_traits<char>>);
  return;
}

Assistant:

void
Amr::printGridInfo (std::ostream& os,
                    int           min_lev,
                    int           max_lev)
{
    for (int lev = min_lev; lev <= max_lev; lev++)
    {
        const BoxArray&           bs      = amr_level[lev]->boxArray();
        int                       numgrid = bs.size();
        Long                      ncells  = amr_level[lev]->countCells();
        double                    ntot    = Geom(lev).Domain().d_numPts();
        Real                      frac    = Real(100.0 * double(ncells) / ntot);
        const DistributionMapping& map    = amr_level[lev]->get_new_data(0).DistributionMap();

        os << "  Level "
           << lev
           << "   "
           << numgrid
           << " grids  "
           << ncells
           << " cells  "
           << frac
           << " % of domain"
           << '\n';


        for (int k = 0; k < numgrid; k++)
        {
            const Box& b = bs[k];

            os << ' ' << lev << ": " << b << "   ";

            for (int i = 0; i < AMREX_SPACEDIM; i++)
                os << b.length(i) << ' ';

            os << ":: " << map[k] << '\n';
        }
    }

    os << std::endl; // Make sure we flush!
}